

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4402ef::ElaboratedTypeSpefType::printLeft
          (ElaboratedTypeSpefType *this,OutputStream *S)

{
  char *__src;
  Node *pNVar1;
  size_t sVar2;
  
  __src = (this->Kind).First;
  sVar2 = (long)(this->Kind).Last - (long)__src;
  if (sVar2 != 0) {
    OutputStream::grow(S,sVar2);
    memmove(S->Buffer + S->CurrentPosition,__src,sVar2);
    S->CurrentPosition = S->CurrentPosition + sVar2;
  }
  OutputStream::grow(S,1);
  sVar2 = S->CurrentPosition;
  S->CurrentPosition = sVar2 + 1;
  S->Buffer[sVar2] = ' ';
  pNVar1 = this->Child;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache == No) {
    return;
  }
  (*pNVar1->_vptr_Node[5])(pNVar1,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Kind;
    S += ' ';
    Child->print(S);
  }